

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastq_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserFastqTest_CompressedParseInChunks_Test::
~BioparserFastqTest_CompressedParseInChunks_Test
          (BioparserFastqTest_CompressedParseInChunks_Test *this)

{
  BioparserFastqTest::~BioparserFastqTest(&this->super_BioparserFastqTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserFastqTest, CompressedParseInChunks) {
  Setup("sample.fastq.gz");
  for (auto t = p->Parse(65536); !t.empty(); t = p->Parse(65536)) {
    s.insert(
        s.end(),
        std::make_move_iterator(t.begin()),
        std::make_move_iterator(t.end()));
  }
  Check();
}